

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_kv_io_init(Pager *pPager,unqlite_kv_methods *pMethods,unqlite_kv_io *pIo)

{
  unqlite_kv_io *pIo_local;
  unqlite_kv_methods *pMethods_local;
  Pager *pPager_local;
  
  pIo->pHandle = pPager;
  pIo->pMethods = pMethods;
  pIo->xGet = unqliteKvIoPageGet;
  pIo->xLookup = unqliteKvIoPageLookup;
  pIo->xNew = unqliteKvIoNewPage;
  pIo->xWrite = unqliteKvIopageWrite;
  pIo->xDontWrite = unqliteKvIoPageDontWrite;
  pIo->xDontJournal = unqliteKvIoPageDontJournal;
  pIo->xDontMkHot = unqliteKvIoPageDontMakeHot;
  pIo->xPageRef = unqliteKvIopage_ref;
  pIo->xPageUnref = unqliteKvIoPageUnRef;
  pIo->xPageSize = unqliteKvIoPageSize;
  pIo->xReadOnly = unqliteKvIoReadOnly;
  pIo->xTmpPage = unqliteKvIoTempPage;
  pIo->xSetUnpin = unqliteKvIoPageUnpin;
  pIo->xSetReload = unqliteKvIoPageReload;
  pIo->xErr = unqliteKvIoErr;
  return 0;
}

Assistant:

static int pager_kv_io_init(Pager *pPager,unqlite_kv_methods *pMethods,unqlite_kv_io *pIo)
{
	pIo->pHandle =  pPager;
	pIo->pMethods = pMethods;
	
	pIo->xGet    = unqliteKvIoPageGet;
	pIo->xLookup = unqliteKvIoPageLookup;
	pIo->xNew    = unqliteKvIoNewPage;
	
	pIo->xWrite     = unqliteKvIopageWrite; 
	pIo->xDontWrite = unqliteKvIoPageDontWrite;
	pIo->xDontJournal = unqliteKvIoPageDontJournal;
	pIo->xDontMkHot = unqliteKvIoPageDontMakeHot;

	pIo->xPageRef   = unqliteKvIopage_ref;
	pIo->xPageUnref = unqliteKvIoPageUnRef;

	pIo->xPageSize = unqliteKvIoPageSize;
	pIo->xReadOnly = unqliteKvIoReadOnly;

	pIo->xTmpPage =  unqliteKvIoTempPage;

	pIo->xSetUnpin = unqliteKvIoPageUnpin;
	pIo->xSetReload = unqliteKvIoPageReload;

	pIo->xErr = unqliteKvIoErr;

	return UNQLITE_OK;
}